

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_dtls_replay_check(mbedtls_ssl_context *ssl)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t bit;
  uint64_t rec_seqnum;
  mbedtls_ssl_context *ssl_local;
  
  uVar1 = ssl_load_six_bytes(ssl->in_ctr + 2);
  if (ssl->conf->anti_replay == '\0') {
    ssl_local._4_4_ = 0;
  }
  else if (ssl->in_window_top < uVar1) {
    ssl_local._4_4_ = 0;
  }
  else {
    uVar2 = ssl->in_window_top - uVar1;
    if (uVar2 < 0x40) {
      if ((ssl->in_window & 1L << ((byte)uVar2 & 0x3f)) == 0) {
        ssl_local._4_4_ = 0;
      }
      else {
        ssl_local._4_4_ = -1;
      }
    }
    else {
      ssl_local._4_4_ = -1;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_dtls_replay_check(mbedtls_ssl_context const *ssl)
{
    uint64_t rec_seqnum = ssl_load_six_bytes(ssl->in_ctr + 2);
    uint64_t bit;

    if (ssl->conf->anti_replay == MBEDTLS_SSL_ANTI_REPLAY_DISABLED) {
        return 0;
    }

    if (rec_seqnum > ssl->in_window_top) {
        return 0;
    }

    bit = ssl->in_window_top - rec_seqnum;

    if (bit >= 64) {
        return -1;
    }

    if ((ssl->in_window & ((uint64_t) 1 << bit)) != 0) {
        return -1;
    }

    return 0;
}